

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_158c745::TestBuilder::DoPush
          (TestBuilder *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  long lVar1;
  pointer pbVar2;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->havePush == true) {
    pbVar2 = (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    b._M_extent._M_extent_value =
         (long)(this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
    b._M_ptr = pbVar2;
    CScript::operator<<(&((this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start)->scriptSig,b);
    this->havePush = false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->push,data);
  this->havePush = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoPush(const std::vector<unsigned char>& data)
    {
        DoPush();
        push = data;
        havePush = true;
    }